

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_7zip.c
# Opt level: O2

void test_basic(char *compression_type)

{
  int iVar1;
  mode_t mVar2;
  void *buff;
  archive *paVar3;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  la_ssize_t lVar7;
  la_int64_t lVar8;
  size_t used;
  archive_entry *ae;
  char filedata [64];
  
  buff = malloc(1000);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'*',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_7zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",paVar3);
  if (compression_type != (char *)0x0) {
    iVar1 = archive_write_set_format_option(paVar3,"7zip","compression",compression_type);
    if (iVar1 != 0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                     ,L'/');
      test_skipping("%s writing not fully supported on this platform",compression_type);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                          ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(buff);
      return;
    }
  }
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,1000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",paVar3);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'<',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,1,10);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'>',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'?',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(ae,"empty");
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'A',"empty","\"empty\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(ae,0x81ed);
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'C',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(ae);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'K',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,1,10);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'M',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'N',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(ae,"empty2");
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'P',"empty2","\"empty2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(ae,0x8124);
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'R',0x8124,"(AE_IFREG | 0444)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(ae);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Z',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,1,100);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\\',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L']',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(ae,"file");
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'_',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(ae,0x81ed);
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'a',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(ae,8);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'd',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(ae);
  lVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'f',8,"8",lVar7,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  lVar7 = archive_write_data(paVar3,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'g',0,"0",lVar7,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'l',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,1,10);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'n',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'o',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(ae,"file2");
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'q',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(ae,0x81ed);
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L's',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(ae,4);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(ae);
  lVar7 = archive_write_data(paVar3,"1234",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'x',4,"4",lVar7,"archive_write_data(a, \"1234\", 5)",(void *)0x0);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'}',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,1,10);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x7f',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x80',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(ae,"symbolic");
  archive_entry_copy_symlink(ae,"file1");
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'\x83',"symbolic","\"symbolic\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  archive_entry_set_mode(ae,0xa1ed);
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x85',0xa1ed,"(AE_IFLNK | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0)
  ;
  archive_entry_free(ae);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'\x8d',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,0xb,100);
  archive_entry_copy_pathname(ae,"dir");
  archive_entry_set_mode(ae,0x41ed);
  archive_entry_set_size(ae,0x200);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x95',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(ae);
  lVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x97',0,"0",lVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'\x9c',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,0xb,200);
  archive_entry_copy_pathname(ae,"dir/subdir");
  archive_entry_set_mode(ae,0x41ed);
  archive_entry_set_size(ae,0x200);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¤',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(ae);
  lVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¦',0,"0",lVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'«',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mtime(ae,0xb,300);
  archive_entry_copy_pathname(ae,"dir/subdir/subdir");
  archive_entry_set_mode(ae,0x41ed);
  archive_entry_set_size(ae,0x200);
  iVar1 = archive_write_header(paVar3,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'±',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'³',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(ae);
  lVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'µ',0,"0",lVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¸',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¼',buff,"buff",anon_var_dwarf_fcd92,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\"",8,"8",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Â',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3)
  ;
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3)
  ;
  iVar1 = read_open_memory_seek(paVar3,buff,used,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ë',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ì',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Í',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Î',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ï',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ð',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ñ',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,filedata,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ó',8,"8",lVar7,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ô',filedata,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Û',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ü',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ý',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Þ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ß',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'à',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'á',4,"4",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,filedata,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ã',4,"4",lVar7,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ä',filedata,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'é',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ê',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ë',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ì',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'í',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'î',"symbolic","\"symbolic\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  pcVar6 = archive_entry_symlink(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ï',"file1","\"file1\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ð',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ñ',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'÷',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ø',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ù',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ú',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'û',"empty","\"empty\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ü',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ý',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ă',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ą',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ą',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ć',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ć',"empty2","\"empty2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĉ',0x8124,"AE_IFREG | 0444",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĉ',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ď',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ď',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Đ',300,"300",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'đ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ē',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ē',"dir/subdir/subdir/","\"dir/subdir/subdir/\"",pcVar6,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĕ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĕ',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ė',0,"0",lVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ě',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĝ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĝ',200,"200",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ğ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ğ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ġ',"dir/subdir/","\"dir/subdir/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ġ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ģ',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ģ',0,"0",lVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĩ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ī',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ī',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĭ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ĭ',"dir/","\"dir/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Į',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'į',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'İ',0,"0",lVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĳ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ķ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",paVar3)
  ;
  iVar1 = archive_format(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ķ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(buff);
  return;
}

Assistant:

static void
test_basic(const char *compression_type)
{
	char filedata[64];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1000;
	char *buff;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_7zip(a));
	if (compression_type != NULL &&
	    ARCHIVE_OK != archive_write_set_format_option(a, "7zip",
	    "compression", compression_type)) {
		skipping("%s writing not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write an empty file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "empty");
	assertEqualString("empty", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write another empty file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "empty2");
	assertEqualString("empty2", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0444);
	assertEqualInt((AE_IFREG | 0444), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 100);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(100, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);

	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "file2");
	assertEqualString("file2", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 4);

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "1234", 5));

	/*
	 * Write a symbolic file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "symbolic");
	archive_entry_copy_symlink(ae, "file1");
	assertEqualString("symbolic", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 100);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	archive_entry_set_size(ae, 512);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/*
	 * Write a sub directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 200);
	archive_entry_copy_pathname(ae, "dir/subdir");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	archive_entry_set_size(ae, 512);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/*
	 * Write a sub sub-directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 300);
	archive_entry_copy_pathname(ae, "dir/subdir/subdir");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	archive_entry_set_size(ae, 512);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the initial header. */
	assertEqualMem(buff, "\x37\x7a\xbc\xaf\x27\x1c\x00\x03", 8);

	/*
	 * Now, read the data back.
	 */
	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));

	/*
	 * Read and verify first file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(100, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/*
	 * Read the second file back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(4, archive_entry_size(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/*
	 * Read and verify a symbolic file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symbolic", archive_entry_pathname(ae));
	assertEqualString("file1", archive_entry_symlink(ae));
	assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read and verify an empty file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("empty", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read and verify an empty file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("empty2", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0444, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read the sub sub-dir entry back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(300, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/subdir/subdir/", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/*
	 * Read the sub dir entry back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(200, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/subdir/", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/*
	 * Read the dir entry back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(100, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(buff);
}